

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3DbSpanDup(sqlite3 *db,char *zStart,char *zEnd)

{
  long lVar1;
  u64 uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  byte *z;
  ulong uVar6;
  u64 n;
  
  uVar3 = (int)zEnd - (int)zStart;
  do {
    uVar5 = uVar3;
    z = (byte *)zStart;
    uVar6 = (ulong)uVar5;
    zStart = (char *)(z + 1);
    uVar3 = uVar5 - 1;
  } while ((""[*z] & 1) != 0);
  uVar2 = (long)(int)uVar5;
  do {
    n = uVar2;
    if ((int)uVar6 < 1) break;
    lVar1 = uVar6 - 1;
    uVar6 = uVar6 - 1;
    uVar2 = n - 1;
  } while ((""[z[lVar1]] & 1) != 0);
  pcVar4 = sqlite3DbStrNDup(db,(char *)z,n);
  return pcVar4;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbSpanDup(sqlite3 *db, const char *zStart, const char *zEnd){
  int n;
  while( sqlite3Isspace(zStart[0]) ) zStart++;
  n = (int)(zEnd - zStart);
  while( ALWAYS(n>0) && sqlite3Isspace(zStart[n-1]) ) n--;
  return sqlite3DbStrNDup(db, zStart, n);
}